

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_macroblock(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,h262_macroblock *mb,
                   uint32_t *qsc)

{
  int iVar1;
  int local_40;
  uint local_3c;
  int i;
  uint32_t mb_flags;
  uint32_t *qsc_local;
  h262_macroblock *mb_local;
  h262_picparm *picparm_local;
  h262_seqparm *seqparm_local;
  bitstream *str_local;
  
  local_3c = mb->macroblock_quant | mb->macroblock_motion_forward * 2 |
             mb->macroblock_motion_backward << 2 | mb->macroblock_pattern << 3 |
             mb->macroblock_intra << 4;
  _i = qsc;
  qsc_local = &mb->macroblock_skipped;
  mb_local = (h262_macroblock *)picparm;
  picparm_local = (h262_picparm *)seqparm;
  seqparm_local = (h262_seqparm *)str;
  switch(picparm->picture_coding_type) {
  case 1:
    iVar1 = vs_vlc(str,&local_3c,mbf_i_vlc);
    if (iVar1 != 0) {
      return 1;
    }
    break;
  case 2:
    iVar1 = vs_vlc(str,&local_3c,mbf_p_vlc);
    if (iVar1 != 0) {
      return 1;
    }
    break;
  case 3:
    iVar1 = vs_vlc(str,&local_3c,mbf_b_vlc);
    if (iVar1 != 0) {
      return 1;
    }
    break;
  case 4:
    iVar1 = vs_vlc(str,&local_3c,mbf_d_vlc);
    if (iVar1 != 0) {
      return 1;
    }
    break;
  default:
    fprintf(_stderr,"Invalid picture type\n");
    return 1;
  }
  if (seqparm_local->horizontal_size == 1) {
    *qsc_local = 0;
    qsc_local[1] = local_3c & 1;
    qsc_local[2] = local_3c >> 1 & 1;
    qsc_local[3] = local_3c >> 2 & 1;
    qsc_local[4] = local_3c >> 3 & 1;
    qsc_local[5] = local_3c >> 4 & 1;
  }
  if ((qsc_local[2] == 0) && (qsc_local[3] == 0)) {
    if (mb_local->motion_vertical_field_select[1][1] == 3) {
      iVar1 = vs_infer((bitstream *)seqparm_local,qsc_local + 6,2);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = vs_infer((bitstream *)seqparm_local,qsc_local + 7,1);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  else if (mb_local->motion_vertical_field_select[1][1] == 3) {
    if (mb_local->motion_code[0][0][1] == 0) {
      iVar1 = vs_u((bitstream *)seqparm_local,qsc_local + 6,2);
      if (iVar1 != 0) {
        return 1;
      }
      if (qsc_local[6] == 0) {
        fprintf(_stderr,"Invalid frame_motion_type\n");
        return 1;
      }
    }
    else {
      iVar1 = vs_infer((bitstream *)seqparm_local,qsc_local + 6,2);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  else {
    iVar1 = vs_u((bitstream *)seqparm_local,qsc_local + 7,2);
    if (iVar1 != 0) {
      return 1;
    }
    if (qsc_local[7] == 0) {
      fprintf(_stderr,"Invalid field_motion_type\n");
      return 1;
    }
  }
  if (((mb_local->motion_vertical_field_select[1][1] == 3) && (mb_local->motion_code[0][0][1] == 0))
     && ((qsc_local[5] != 0 || (qsc_local[4] != 0)))) {
    iVar1 = vs_u((bitstream *)seqparm_local,qsc_local + 8,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    iVar1 = vs_infer((bitstream *)seqparm_local,qsc_local + 8,0);
    if (iVar1 != 0) {
      return 1;
    }
  }
  if (qsc_local[1] == 0) {
    iVar1 = vs_infer((bitstream *)seqparm_local,qsc_local + 9,*_i);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    iVar1 = vs_u((bitstream *)seqparm_local,qsc_local + 9,5);
    if (iVar1 != 0) {
      return 1;
    }
  }
  *_i = qsc_local[9];
  if ((qsc_local[2] == 0) && ((qsc_local[5] == 0 || (mb_local->motion_code[0][1][0] == 0)))) {
    iVar1 = h262_infer_vectors((bitstream *)seqparm_local,(h262_seqparm *)picparm_local,
                               (h262_picparm *)mb_local,(h262_macroblock *)qsc_local,0);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    iVar1 = h262_motion_vectors((bitstream *)seqparm_local,(h262_seqparm *)picparm_local,
                                (h262_picparm *)mb_local,(h262_macroblock *)qsc_local,0);
    if (iVar1 != 0) {
      return 1;
    }
  }
  if (qsc_local[3] == 0) {
    iVar1 = h262_infer_vectors((bitstream *)seqparm_local,(h262_seqparm *)picparm_local,
                               (h262_picparm *)mb_local,(h262_macroblock *)qsc_local,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    iVar1 = h262_motion_vectors((bitstream *)seqparm_local,(h262_seqparm *)picparm_local,
                                (h262_picparm *)mb_local,(h262_macroblock *)qsc_local,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  if (((qsc_local[5] == 0) || (mb_local->motion_code[0][1][0] == 0)) ||
     (iVar1 = vs_mark((bitstream *)seqparm_local,1,1), iVar1 == 0)) {
    if (qsc_local[5] == 0) {
      if (qsc_local[4] == 0) {
        iVar1 = vs_infer((bitstream *)seqparm_local,qsc_local + 0x20,0);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        iVar1 = h262_coded_block_pattern
                          ((bitstream *)seqparm_local,
                           picparm_local->non_intra_quantiser_matrix[0x2d],qsc_local + 0x20);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    else {
      iVar1 = vs_infer((bitstream *)seqparm_local,qsc_local + 0x20,
                       (1 << ((byte)h262_macroblock::block_count
                                    [picparm_local->non_intra_quantiser_matrix[0x2d]] & 0x1f)) - 1);
      if (iVar1 != 0) {
        return 1;
      }
    }
    for (local_40 = 0;
        local_40 < h262_macroblock::block_count[picparm_local->non_intra_quantiser_matrix[0x2d]];
        local_40 = local_40 + 1) {
      if (((qsc_local[0x20] & 1 << ((byte)local_40 & 0x1f)) != 0) &&
         (iVar1 = h262_block((bitstream *)seqparm_local,(h262_seqparm *)picparm_local,
                             (h262_picparm *)mb_local,
                             (int32_t *)(qsc_local + (long)local_40 * 0x40 + 0x21),qsc_local[5],
                             (uint)(3 < local_40)), iVar1 != 0)) {
        return 1;
      }
    }
    if ((mb_local->macroblock_quant == 4) &&
       (iVar1 = vs_mark((bitstream *)seqparm_local,1,1), iVar1 != 0)) {
      str_local._4_4_ = 1;
    }
    else {
      str_local._4_4_ = 0;
    }
  }
  else {
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

int h262_macroblock(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, uint32_t *qsc) {
	uint32_t mb_flags = mb->macroblock_quant
		| mb->macroblock_motion_forward << 1
		| mb->macroblock_motion_backward << 2
		| mb->macroblock_pattern << 3
		| mb->macroblock_intra << 4;
	switch (picparm->picture_coding_type) {
		case H262_PIC_TYPE_I:
			if (vs_vlc(str, &mb_flags, mbf_i_vlc)) return 1;
			break;
		case H262_PIC_TYPE_P:
			if (vs_vlc(str, &mb_flags, mbf_p_vlc)) return 1;
			break;
		case H262_PIC_TYPE_B:
			if (vs_vlc(str, &mb_flags, mbf_b_vlc)) return 1;
			break;
		case H262_PIC_TYPE_D:
			if (vs_vlc(str, &mb_flags, mbf_d_vlc)) return 1;
			break;
		default:
			fprintf(stderr, "Invalid picture type\n");
			return 1;
	}
	if (str->dir == VS_DECODE) {
		mb->macroblock_skipped = 0;
		mb->macroblock_quant = mb_flags >> 0 & 1;
		mb->macroblock_motion_forward = mb_flags >> 1 & 1;
		mb->macroblock_motion_backward = mb_flags >> 2 & 1;
		mb->macroblock_pattern = mb_flags >> 3 & 1;
		mb->macroblock_intra = mb_flags >> 4 & 1;
	}
	if (mb->macroblock_motion_forward || mb->macroblock_motion_backward) {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			if (picparm->frame_pred_frame_dct) {
				if (vs_infer(str, &mb->frame_motion_type, H262_FRAME_MOTION_FRAME)) return 1;
			} else {
				if (vs_u(str, &mb->frame_motion_type, 2)) return 1;
				if (!mb->frame_motion_type) {
					fprintf(stderr, "Invalid frame_motion_type\n");
					return 1;
				}
			}
		} else {
			if (vs_u(str, &mb->field_motion_type, 2)) return 1;
			if (!mb->field_motion_type) {
				fprintf(stderr, "Invalid field_motion_type\n");
				return 1;
			}
		}
	} else {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			if (vs_infer(str, &mb->frame_motion_type, H262_FRAME_MOTION_FRAME)) return 1;
		} else {
			if (vs_infer(str, &mb->field_motion_type, H262_FIELD_MOTION_FIELD)) return 1;
		}
	}
	if (picparm->picture_structure == H262_PIC_STRUCT_FRAME && !picparm->frame_pred_frame_dct && (mb->macroblock_intra || mb->macroblock_pattern)) {
		if (vs_u(str, &mb->dct_type, 1)) return 1;
	} else {
		if (vs_infer(str, &mb->dct_type, 0)) return 1;
	}
	if (mb->macroblock_quant) {
		if (vs_u(str, &mb->quantiser_scale_code, 5)) return 1;
	} else {
		if (vs_infer(str, &mb->quantiser_scale_code, *qsc)) return 1;
	}
	*qsc = mb->quantiser_scale_code;
	if (mb->macroblock_motion_forward || (mb->macroblock_intra && picparm->concealment_motion_vectors)) {
		if (h262_motion_vectors(str, seqparm, picparm, mb, 0)) return 1;
	} else {
		if (h262_infer_vectors(str, seqparm, picparm, mb, 0)) return 1;
	}
	if (mb->macroblock_motion_backward) {
		if (h262_motion_vectors(str, seqparm, picparm, mb, 1)) return 1;
	} else {
		if (h262_infer_vectors(str, seqparm, picparm, mb, 1)) return 1;
	}
	if (mb->macroblock_intra && picparm->concealment_motion_vectors)
		if (vs_mark(str, 1, 1)) return 1;
	static const int block_count[4] = { 4, 6, 8, 12 };
	if (mb->macroblock_intra) {
		if (vs_infer(str, &mb->coded_block_pattern, (1 << block_count[seqparm->chroma_format]) - 1)) return 1;
	} else if (mb->macroblock_pattern) {
		if (h262_coded_block_pattern(str, seqparm->chroma_format, &mb->coded_block_pattern)) return 1;
	} else {
		if (vs_infer(str, &mb->coded_block_pattern, 0)) return 1;
	}
	int i;
	for (i = 0; i < block_count[seqparm->chroma_format]; i++)
		if (mb->coded_block_pattern & 1 << i) {
			if (h262_block(str, seqparm, picparm, mb->block[i], mb->macroblock_intra, i >= 4)) return 1;
		}
	if (picparm->picture_coding_type == H262_PIC_TYPE_D)
		if (vs_mark(str, 1, 1)) return 1;
	return 0;
}